

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Operation<short,duckdb::hugeint_t,duckdb::ArgMinMaxState<short,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<short,_duckdb::hugeint_t> *state,short *x,hugeint_t *y,
               AggregateBinaryInput *binary)

{
  unsigned_long *puVar1;
  int64_t iVar2;
  AggregateBinaryInput *in_R9;
  bool bVar3;
  hugeint_t y_data;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    y_data.upper = (int64_t)binary;
    y_data.lower = y->upper;
    Execute<short,duckdb::hugeint_t,duckdb::ArgMinMaxState<short,duckdb::hugeint_t>>
              ((ArgMinMaxBase<duckdb::LessThan,false> *)state,
               (ArgMinMaxState<short,_duckdb::hugeint_t> *)(ulong)(uint)(int)*x,(short)y->lower,
               y_data,in_R9);
    return;
  }
  puVar1 = (binary->right_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if ((puVar1 != (unsigned_long *)0x0) &&
     ((puVar1[binary->ridx >> 6] >> (binary->ridx & 0x3f) & 1) == 0)) {
    return;
  }
  puVar1 = (binary->left_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    (state->super_ArgMinMaxStateBase).arg_null = false;
  }
  else {
    bVar3 = (puVar1[binary->lidx >> 6] >> (binary->lidx & 0x3f) & 1) == 0;
    (state->super_ArgMinMaxStateBase).arg_null = bVar3;
    if (bVar3) goto LAB_0048555d;
  }
  state->arg = *x;
LAB_0048555d:
  iVar2 = y->upper;
  (state->value).lower = y->lower;
  (state->value).upper = iVar2;
  (state->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}